

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 floatx80_div_mips(floatx80 a,floatx80 b,float_status *status)

{
  floatx80 fVar1;
  ushort uVar2;
  uint64_t b_00;
  uint64_t b_01;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  uint uVar6;
  ulong a0;
  ulong b_02;
  ulong uVar7;
  ulong a0_00;
  long lVar8;
  bool bVar9;
  floatx80 fVar10;
  uint local_54;
  uint64_t term1;
  uint local_44;
  uint64_t term2;
  uint64_t term0;
  
  b_02 = b.low;
  uVar7 = a.low;
  uVar2 = a.high & 0x7fff;
  if (-1 < (long)uVar7 && ((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0)
  {
LAB_0069a26c:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar10 = floatx80_default_nan_mips(status);
    fVar1._10_6_ = fVar10._10_6_;
    fVar1.high = 0xffff;
    fVar1.low = 0xc000000000000000;
    return fVar1;
  }
  uVar5 = b.high & 0x7fff;
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 && -1 < (long)b_02)
  goto LAB_0069a26c;
  uVar4 = b._8_4_ ^ a._8_4_;
  if (uVar2 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      if (uVar5 != 0x7fff) {
LAB_0069a460:
        fVar10._12_4_ = 0;
        fVar10._8_4_ = uVar4 | 0x7fff;
        fVar10.low = 0x8000000000000000;
        return fVar10;
      }
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_0069a26c;
    }
LAB_0069a2f0:
    fVar10 = propagateFloatx80NaN_mips(a,b,status);
    return fVar10;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (b_02 == 0) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 || uVar7 != 0) {
        status->float_exception_flags = status->float_exception_flags | 4;
        goto LAB_0069a460;
      }
      goto LAB_0069a26c;
    }
    uVar3 = 0x3f;
    if (b_02 != 0) {
      for (; b_02 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    b_02 = b_02 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
    uVar6 = 1 - (int)(uVar3 ^ 0x3f);
  }
  else {
    uVar6 = (uint)uVar5;
    if (uVar5 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0)
      goto LAB_0069a2f0;
      goto LAB_0069a452;
    }
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
    if (uVar7 == 0) {
LAB_0069a452:
      return (floatx80)(ZEXT416(uVar4 & 0x8000) << 0x40);
    }
    uVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar7 = uVar7 << ((byte)(uVar3 ^ 0x3f) & 0x3f);
    local_54 = 1 - (int)(uVar3 ^ 0x3f);
  }
  else {
    local_54 = (uint)uVar2;
  }
  local_44 = (uVar4 & 0xffff) >> 0xf;
  uVar3 = 0;
  if (b_02 <= uVar7) {
    uVar3 = uVar7 << 0x3f;
  }
  a0_00 = uVar7 >> (b_02 <= uVar7);
  b_00 = estimateDiv128To64(a0_00,uVar3,b_02);
  mul64To128(b_02,b_00,&term0,&term1);
  a0 = uVar3 - term1;
  for (lVar8 = (a0_00 - term0) - (ulong)(uVar3 < term1); lVar8 < 0; lVar8 = lVar8 + (ulong)bVar9) {
    b_00 = b_00 - 1;
    bVar9 = CARRY8(a0,b_02);
    a0 = a0 + b_02;
  }
  b_01 = estimateDiv128To64(a0,0,b_02);
  if (b_01 * 2 < 9) {
    mul64To128(b_02,b_01,&term1,&term2);
    uVar3 = -term2;
    for (lVar8 = (-term1 - (ulong)(term2 != 0)) + a0; lVar8 < 0; lVar8 = lVar8 + (ulong)bVar9) {
      b_01 = b_01 - 1;
      bVar9 = CARRY8(uVar3,b_02);
      uVar3 = uVar3 + b_02;
    }
    b_01 = b_01 | (uVar3 != 0 || lVar8 != 0);
  }
  fVar10 = roundAndPackFloatx80_mips
                     (status->floatx80_rounding_precision,(flag)local_44,
                      (local_54 - uVar6) + (b_02 <= uVar7 | 0x3ffe),b_00,b_01,status);
  return fVar10;
}

Assistant:

floatx80 floatx80_div(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, bSign, zSign;
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    uint64_t rem0, rem1, rem2, term0, term1, term2;

    if (floatx80_invalid_encoding(a) || floatx80_invalid_encoding(b)) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    bSign = extractFloatx80Sign( b );
    zSign = aSign ^ bSign;
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            goto invalid;
        }
        return packFloatx80(zSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80( zSign, 0, 0 );
    }
    if ( bExp == 0 ) {
        if ( bSig == 0 ) {
            if ( ( aExp | aSig ) == 0 ) {
 invalid:
                float_raise(float_flag_invalid, status);
                return floatx80_default_nan(status);
            }
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(zSign, floatx80_infinity_high,
                                       floatx80_infinity_low);
        }
        normalizeFloatx80Subnormal( bSig, &bExp, &bSig );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloatx80( zSign, 0, 0 );
        normalizeFloatx80Subnormal( aSig, &aExp, &aSig );
    }
    zExp = aExp - bExp + 0x3FFE;
    rem1 = 0;
    if ( bSig <= aSig ) {
        shift128Right( aSig, 0, 1, &aSig, &rem1 );
        ++zExp;
    }
    zSig0 = estimateDiv128To64( aSig, rem1, bSig );
    mul64To128( bSig, zSig0, &term0, &term1 );
    sub128( aSig, rem1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        add128( rem0, rem1, 0, bSig, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, bSig );
    if ( (uint64_t) ( zSig1<<1 ) <= 8 ) {
        mul64To128( bSig, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            add128( rem1, rem2, 0, bSig, &rem1, &rem2 );
        }
        zSig1 |= ( ( rem1 | rem2 ) != 0 );
    }
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}